

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::
     RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_int>,ImPlot::TransformerLinLog>>
               (RectRenderer<ImPlot::GetterHeatmap<unsigned_int>,_ImPlot::TransformerLinLog>
                *renderer,ImDrawList *DrawList,ImRect *cull_rect)

{
  bool bVar1;
  uint uVar2;
  int prim;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ImVec2 uv;
  ImVec2 local_48;
  uint local_3c;
  ulong local_38;
  
  uVar6 = renderer->Prims;
  local_48 = DrawList->_Data->TexUvWhitePixel;
  if (uVar6 == 0) {
    uVar7 = 0;
  }
  else {
    prim = 0;
    uVar7 = 0;
    do {
      uVar2 = 0xffff - DrawList->_VtxCurrentIdx >> 2;
      uVar5 = uVar2;
      if (uVar6 < uVar2) {
        uVar5 = uVar6;
      }
      uVar4 = (ulong)uVar5;
      uVar3 = 0x40;
      if (uVar6 < 0x40) {
        uVar3 = uVar6;
      }
      if (uVar2 < uVar3) {
        if (uVar7 != 0) {
          ImDrawList::PrimUnreserve(DrawList,uVar7 * 6,uVar7 << 2);
        }
        uVar4 = 0x3fff;
        if (uVar6 < 0x3fff) {
          uVar4 = (ulong)uVar6;
        }
        ImDrawList::PrimReserve(DrawList,(int)uVar4 * 6,(int)uVar4 * 4);
        uVar2 = 0;
      }
      else {
        uVar2 = uVar7 - uVar5;
        if (uVar7 < uVar5) {
          ImDrawList::PrimReserve(DrawList,(uVar5 - uVar7) * 6,(uVar5 - uVar7) * 4);
          uVar2 = 0;
        }
      }
      uVar5 = (uint)uVar4;
      local_38 = uVar4;
      local_3c = uVar6;
      uVar7 = uVar2;
      while (uVar5 != 0) {
        bVar1 = RectRenderer<ImPlot::GetterHeatmap<unsigned_int>,_ImPlot::TransformerLinLog>::
                operator()(renderer,DrawList,cull_rect,&local_48,prim);
        uVar7 = uVar7 + !bVar1;
        prim = prim + 1;
        uVar5 = (int)uVar4 - 1;
        uVar4 = (ulong)uVar5;
      }
      uVar6 = local_3c - (int)local_38;
    } while (uVar6 != 0);
  }
  if (uVar7 != 0) {
    ImDrawList::PrimUnreserve(DrawList,uVar7 * 6,uVar7 << 2);
  }
  return;
}

Assistant:

inline void RenderPrimitives(const Renderer& renderer, ImDrawList& DrawList, const ImRect& cull_rect) {
    unsigned int prims        = renderer.Prims;
    unsigned int prims_culled = 0;
    unsigned int idx          = 0;
    const ImVec2 uv = DrawList._Data->TexUvWhitePixel;
    while (prims) {
        // find how many can be reserved up to end of current draw command's limit
        unsigned int cnt = ImMin(prims, (MaxIdx<ImDrawIdx>::Value - DrawList._VtxCurrentIdx) / Renderer::VtxConsumed);
        // make sure at least this many elements can be rendered to avoid situations where at the end of buffer this slow path is not taken all the time
        if (cnt >= ImMin(64u, prims)) {
            if (prims_culled >= cnt)
                prims_culled -= cnt; // reuse previous reservation
            else {
                DrawList.PrimReserve((cnt - prims_culled) * Renderer::IdxConsumed, (cnt - prims_culled) * Renderer::VtxConsumed); // add more elements to previous reservation
                prims_culled = 0;
            }
        }
        else
        {
            if (prims_culled > 0) {
                DrawList.PrimUnreserve(prims_culled * Renderer::IdxConsumed, prims_culled * Renderer::VtxConsumed);
                prims_culled = 0;
            }
            cnt = ImMin(prims, (MaxIdx<ImDrawIdx>::Value - 0/*DrawList._VtxCurrentIdx*/) / Renderer::VtxConsumed);
            DrawList.PrimReserve(cnt * Renderer::IdxConsumed, cnt * Renderer::VtxConsumed); // reserve new draw command
        }
        prims -= cnt;
        for (unsigned int ie = idx + cnt; idx != ie; ++idx) {
            if (!renderer(DrawList, cull_rect, uv, idx))
                prims_culled++;
        }
    }
    if (prims_culled > 0)
        DrawList.PrimUnreserve(prims_culled * Renderer::IdxConsumed, prims_culled * Renderer::VtxConsumed);
}